

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderEms.cpp
# Opt level: O0

HighsStatus __thiscall
FilereaderEms::writeModelToFile
          (FilereaderEms *this,HighsOptions *options,string *filename,HighsModel *model)

{
  int iVar1;
  _Setprecision _Var2;
  const_reference pvVar3;
  ostream *poVar4;
  void *pvVar5;
  const_reference pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  int *in_RCX;
  _Ios_Openmode in_EDX;
  size_t i_9;
  size_t i_8;
  HighsInt i_7;
  HighsInt i_6;
  HighsInt i_5;
  HighsInt i_4;
  HighsInt i_3;
  HighsInt i_2;
  HighsInt i_1;
  HighsInt i;
  HighsInt num_nz;
  HighsLp *lp;
  ofstream f;
  ulong local_278;
  ulong local_270;
  int local_268;
  int local_264;
  int local_260;
  int local_258;
  int local_254;
  int local_24c;
  int local_244;
  int local_240;
  ostream local_220;
  int *local_20;
  
  local_20 = in_RCX;
  std::ofstream::ofstream((string *)&local_220);
  std::ofstream::open((string *)&local_220,in_EDX);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(local_20 + 0x24),(long)*local_20);
  iVar1 = *pvVar3;
  poVar4 = std::operator<<(&local_220,"n_rows");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pvVar5 = (void *)std::ostream::operator<<(&local_220,local_20[1]);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(&local_220,"n_columns");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pvVar5 = (void *)std::ostream::operator<<(&local_220,*local_20);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(&local_220,"n_matrix_elements");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pvVar5 = (void *)std::ostream::operator<<(&local_220,iVar1);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(&local_220,"matrix");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (local_240 = 0; local_240 < *local_20 + 1; local_240 = local_240 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_20 + 0x24),(long)local_240);
    poVar4 = (ostream *)std::ostream::operator<<(&local_220,*pvVar3);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(&local_220,std::endl<char,std::char_traits<char>>);
  for (local_244 = 0; local_244 < iVar1; local_244 = local_244 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_20 + 0x30),(long)local_244);
    poVar4 = (ostream *)std::ostream::operator<<(&local_220,*pvVar3);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(&local_220,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setprecision(9);
  std::operator<<(&local_220,_Var2);
  for (local_24c = 0; local_24c < iVar1; local_24c = local_24c + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 0x36),(long)local_24c
                       );
    poVar4 = (ostream *)std::ostream::operator<<(&local_220,*pvVar6);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(&local_220,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setprecision(9);
  std::operator<<(&local_220,_Var2);
  poVar4 = std::operator<<(&local_220,"column_bounds");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (local_254 = 0; local_254 < *local_20; local_254 = local_254 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 8),(long)local_254);
    poVar4 = (ostream *)std::ostream::operator<<(&local_220,*pvVar6);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(&local_220,std::endl<char,std::char_traits<char>>);
  for (local_258 = 0; local_258 < *local_20; local_258 = local_258 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 0xe),(long)local_258)
    ;
    poVar4 = (ostream *)std::ostream::operator<<(&local_220,*pvVar6);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(&local_220,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(&local_220,"row_bounds");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setprecision(9);
  std::operator<<(&local_220,_Var2);
  for (local_260 = 0; local_260 < local_20[1]; local_260 = local_260 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 0x14),(long)local_260
                       );
    poVar4 = (ostream *)std::ostream::operator<<(&local_220,*pvVar6);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(&local_220,std::endl<char,std::char_traits<char>>);
  for (local_264 = 0; local_264 < local_20[1]; local_264 = local_264 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 0x1a),(long)local_264
                       );
    poVar4 = (ostream *)std::ostream::operator<<(&local_220,*pvVar6);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(&local_220,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(&local_220,"column_costs");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (local_268 = 0; local_268 < *local_20; local_268 = local_268 + 1) {
    iVar1 = local_20[0x3c];
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 2),(long)local_268);
    poVar4 = (ostream *)std::ostream::operator<<(&local_220,(double)iVar1 * *pvVar6);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(&local_220,std::endl<char,std::char_traits<char>>);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_20 + 0x58));
  if ((sVar7 != 0) &&
     (sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_20 + 0x52)), sVar7 != 0)) {
    poVar4 = std::operator<<(&local_220,"names");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(&local_220,"columns");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    for (local_270 = 0;
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_20 + 0x52)), local_270 < sVar7; local_270 = local_270 + 1) {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_20 + 0x52),local_270);
      poVar4 = std::operator<<(&local_220,(string *)pvVar8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    poVar4 = std::operator<<(&local_220,"rows");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    for (local_278 = 0;
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_20 + 0x58)), local_278 < sVar7; local_278 = local_278 + 1) {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_20 + 0x58),local_278);
      poVar4 = std::operator<<(&local_220,(string *)pvVar8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  if ((*(double *)(local_20 + 0x3e) != 0.0) || (NAN(*(double *)(local_20 + 0x3e)))) {
    poVar4 = std::operator<<(&local_220,"shift");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pvVar5 = (void *)std::ostream::operator<<
                               (pvVar5,(double)local_20[0x3c] * *(double *)(local_20 + 0x3e));
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<(&local_220,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(&local_220);
  return kOk;
}

Assistant:

HighsStatus FilereaderEms::writeModelToFile(const HighsOptions& options,
                                            const std::string filename,
                                            const HighsModel& model) {
  std::ofstream f;
  f.open(filename, std::ios::out);
  const HighsLp& lp = model.lp_;
  HighsInt num_nz = lp.a_matrix_.start_[lp.num_col_];

  // counts
  f << "n_rows" << std::endl;
  f << lp.num_row_ << std::endl;
  f << "n_columns" << std::endl;
  f << lp.num_col_ << std::endl;
  f << "n_matrix_elements" << std::endl;
  f << num_nz << std::endl;

  // matrix
  f << "matrix" << std::endl;
  for (HighsInt i = 0; i < lp.num_col_ + 1; i++)
    f << lp.a_matrix_.start_[i] << " ";
  f << std::endl;

  for (HighsInt i = 0; i < num_nz; i++) f << lp.a_matrix_.index_[i] << " ";
  f << std::endl;

  f << std::setprecision(9);
  for (HighsInt i = 0; i < num_nz; i++) f << lp.a_matrix_.value_[i] << " ";
  f << std::endl;

  // cost and bounds
  f << std::setprecision(9);

  f << "column_bounds" << std::endl;
  for (HighsInt i = 0; i < lp.num_col_; i++) f << lp.col_lower_[i] << " ";
  f << std::endl;

  for (HighsInt i = 0; i < lp.num_col_; i++) f << lp.col_upper_[i] << " ";
  f << std::endl;

  f << "row_bounds" << std::endl;
  f << std::setprecision(9);
  for (HighsInt i = 0; i < lp.num_row_; i++) f << lp.row_lower_[i] << " ";
  f << std::endl;

  for (HighsInt i = 0; i < lp.num_row_; i++) f << lp.row_upper_[i] << " ";
  f << std::endl;

  f << "column_costs" << std::endl;
  for (HighsInt i = 0; i < lp.num_col_; i++)
    f << (HighsInt)lp.sense_ * lp.col_cost_[i] << " ";
  f << std::endl;

  if (lp.row_names_.size() > 0 && lp.col_names_.size() > 0) {
    f << "names" << std::endl;

    f << "columns" << std::endl;
    for (size_t i = 0; i < lp.col_names_.size(); i++)
      f << lp.col_names_[i] << std::endl;

    f << "rows" << std::endl;
    for (size_t i = 0; i < lp.row_names_.size(); i++)
      f << lp.row_names_[i] << std::endl;
  }

  // todo: integer variables.

  if (lp.offset_ != 0)
    f << "shift" << std::endl << (HighsInt)lp.sense_ * lp.offset_ << std::endl;

  f << std::endl;
  f.close();
  return HighsStatus::kOk;
}